

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_opt_get_grad(int np,ggml_tensor **ps,float *g)

{
  int iVar1;
  ggml_tensor *in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar2;
  int j;
  int ne;
  int p;
  int i;
  int local_28;
  int local_20;
  int i_00;
  
  i_00 = 0;
  for (local_20 = 0; local_20 < in_EDI; local_20 = local_20 + 1) {
    iVar1 = ggml_nelements(*(ggml_tensor **)(in_RSI + (long)local_20 * 8));
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      fVar2 = ggml_get_f32_1d(in_RDX,i_00);
      in_RDX->ne[(long)i_00 + -2] = (int)fVar2;
      i_00 = i_00 + 1;
    }
  }
  return;
}

Assistant:

static void ggml_opt_get_grad(int np, struct ggml_tensor * const ps[], float * g) {
    int i = 0;
    for (int p = 0; p < np; ++p) {
        const int ne = ggml_nelements(ps[p]) ;
        // TODO: add function to get all elements at once
        for (int j = 0; j < ne; ++j) {
            g[i++] = ggml_get_f32_1d(ps[p]->grad, j);
        }
    }
}